

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_encoder_isac_t_impl.h
# Opt level: O0

bool __thiscall webrtc::AudioEncoderIsacT<webrtc::IsacFloat>::Config::IsOk(Config *this)

{
  LockedIsacBandwidthInfo *pLVar1;
  bool local_2a;
  bool local_29;
  bool local_28;
  bool local_27;
  bool local_26;
  bool local_25;
  Config *this_local;
  
  if ((this->max_bit_rate < 32000) && (this->max_bit_rate != -1)) {
    this_local._7_1_ = false;
  }
  else if ((this->max_payload_size_bytes < 0x78) && (this->max_payload_size_bytes != -1)) {
    this_local._7_1_ = false;
  }
  else {
    if (((this->adaptive_mode & 1U) != 0) &&
       (pLVar1 = rtc::scoped_refptr::operator_cast_to_LockedIsacBandwidthInfo_
                           ((scoped_refptr *)this), pLVar1 == (LockedIsacBandwidthInfo *)0x0)) {
      return false;
    }
    if (this->sample_rate_hz == 16000) {
      if (this->max_bit_rate < 0xd099) {
        if (this->max_payload_size_bytes < 0x191) {
          if ((this->frame_size_ms == 0x1e) || (local_25 = false, this->frame_size_ms == 0x3c)) {
            local_26 = true;
            if (this->bit_rate != 0) {
              local_27 = false;
              if (9999 < this->bit_rate) {
                local_27 = this->bit_rate < 0x7d01;
              }
              local_26 = local_27;
            }
            local_25 = local_26;
          }
          this_local._7_1_ = local_25;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else if (this->sample_rate_hz == 32000) {
      if (this->max_bit_rate < 0x27101) {
        if (this->max_payload_size_bytes < 0x259) {
          local_28 = false;
          if (this->frame_size_ms == 0x1e) {
            local_29 = true;
            if (this->bit_rate != 0) {
              local_2a = false;
              if (9999 < this->bit_rate) {
                local_2a = this->bit_rate < 0xdac1;
              }
              local_29 = local_2a;
            }
            local_28 = local_29;
          }
          this_local._7_1_ = local_28;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AudioEncoderIsacT<T>::Config::IsOk() const {
  if (max_bit_rate < 32000 && max_bit_rate != -1)
    return false;
  if (max_payload_size_bytes < 120 && max_payload_size_bytes != -1)
    return false;
  if (adaptive_mode && !bwinfo)
    return false;
  switch (sample_rate_hz) {
    case 16000:
      if (max_bit_rate > 53400)
        return false;
      if (max_payload_size_bytes > 400)
        return false;
      return (frame_size_ms == 30 || frame_size_ms == 60) &&
             (bit_rate == 0 || (bit_rate >= 10000 && bit_rate <= 32000));
    case 32000:
      if (max_bit_rate > 160000)
        return false;
      if (max_payload_size_bytes > 600)
        return false;
      return T::has_swb &&
             (frame_size_ms == 30 &&
              (bit_rate == 0 || (bit_rate >= 10000 && bit_rate <= 56000)));
    default:
      return false;
  }
}